

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int opt_prof_active_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                       size_t newlen)

{
  return 2;
}

Assistant:

static int
prof_active_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	bool oldval;

	if (!config_prof) {
		ret = ENOENT;
		goto label_return;
	}

	if (newp != NULL) {
		if (newlen != sizeof(bool)) {
			ret = EINVAL;
			goto label_return;
		}
		bool val = *(bool *)newp;
		if (!opt_prof) {
			if (val) {
				ret = ENOENT;
				goto label_return;
			} else {
				/* No change needed (already off). */
				oldval = false;
			}
		} else {
			oldval = prof_active_set(tsd_tsdn(tsd), val);
		}
	} else {
		oldval = opt_prof ? prof_active_get(tsd_tsdn(tsd)) : false;
	}
	READ(oldval, bool);

	ret = 0;
label_return:
	return ret;
}